

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_value<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
          (result<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc,size_t n_rec)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  const_iterator rollback;
  pointer pcVar3;
  size_type sVar4;
  undefined1 uVar5;
  value_type *pvVar6;
  error_type *peVar7;
  location *loc_00;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt;
  result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_00;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_01;
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_02;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_03;
  result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_04;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_05;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_06;
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_07;
  result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *rslt_08;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_03;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_04;
  result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_05;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_06;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_07;
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_08;
  result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_09;
  _Alloc_hider _Var8;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  string msg;
  allocator_type local_569;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_568;
  undefined1 local_560 [16];
  undefined1 auStack_550 [16];
  string local_540;
  string local_520;
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_500;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4e8;
  pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d0;
  source_location local_460;
  result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_410;
  result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b8;
  result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b0;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_250;
  result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f0;
  result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b0;
  
  rollback._M_current = *(char **)(this + 0x40);
  if (rollback._M_current == *(char **)(*(long *)(this + 8) + 8)) {
    local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_540,"toml::parse_value: input is empty","");
    source_location::source_location(&local_460,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[1],_true>
              (&local_4d0,&local_460,(char (*) [1])0x1715db);
    __l._M_len = 1;
    __l._M_array = &local_4d0;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_500,__l,&local_569);
    local_4e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4e8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    format_underline(&local_520,&local_540,&local_500,&local_4e8,false);
    sVar4 = local_520._M_string_length;
    local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_560 + 8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p == &local_520.field_2) {
      auStack_550._0_8_ = local_520.field_2._8_8_;
      local_520._M_dataplus._M_p = (pointer)local_568;
    }
    local_560._9_7_ = local_520.field_2._M_allocated_capacity._1_7_;
    local_560[8] = local_520.field_2._M_local_buf[0];
    local_520._M_string_length = 0;
    local_520.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_520._M_dataplus._M_p == local_568) {
      paVar1->_M_allocated_capacity = local_560._8_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           auStack_550._0_8_;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = local_520._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_560._8_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = sVar4;
    local_560._0_8_ = (pointer)0x0;
    local_560._8_8_ = (ulong)(uint7)local_520.field_2._M_allocated_capacity._1_7_ << 8;
    local_520._M_dataplus._M_p = (pointer)&local_520.field_2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_4e8);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_500);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4d0.second._M_dataplus._M_p != &local_4d0.second.field_2) {
      operator_delete(local_4d0.second._M_dataplus._M_p,
                      local_4d0.second.field_2._M_allocated_capacity + 1);
    }
    source_location::~source_location(&local_4d0.first);
    source_location::~source_location(&local_460);
    _Var8._M_p = local_540._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._M_dataplus._M_p == &local_540.field_2) {
      return __return_storage_ptr__;
    }
    goto LAB_001245f0;
  }
  bVar2 = *rollback._M_current;
  if (bVar2 < 0x69) {
    if (bVar2 < 0x5b) {
      if ((bVar2 == 0x22) || (bVar2 == 0x27)) {
        uVar5 = 4;
        goto LAB_001241a0;
      }
    }
    else {
      if (bVar2 == 0x5b) {
        uVar5 = 9;
        goto LAB_001241a0;
      }
      if (bVar2 == 0x66) goto LAB_00124190;
    }
LAB_001241fe:
    guess_number_type_abi_cxx11_
              ((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_568,this,loc);
    if (((ulong)local_568 & 1) != 0) goto LAB_001241a4;
    peVar7 = result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap_err((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)&local_568);
    pcVar3 = (peVar7->_M_dataplus)._M_p;
    local_4d0.first._0_8_ = (pointer)((long)&local_4d0 + 0x10U);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4d0,pcVar3,pcVar3 + peVar7->_M_string_length);
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((pointer)local_4d0.first._0_8_ == (pointer)((long)&local_4d0 + 0x10U)) {
      paVar1->_M_allocated_capacity = (size_type)local_4d0.first.file_name_._M_dataplus._M_p;
      *(size_type *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
           local_4d0.first.file_name_._M_string_length;
    }
    else {
      (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p = (pointer)local_4d0.first._0_8_
      ;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
           (size_type)local_4d0.first.file_name_._M_dataplus._M_p;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = local_4d0.first._8_8_;
  }
  else {
    if (bVar2 < 0x74) {
      if ((bVar2 != 0x69) && (bVar2 != 0x6e)) goto LAB_001241fe;
      uVar5 = 3;
    }
    else if (bVar2 == 0x74) {
LAB_00124190:
      uVar5 = 1;
    }
    else {
      if (bVar2 != 0x7b) goto LAB_001241fe;
      uVar5 = 10;
    }
LAB_001241a0:
    local_568 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_568._1_7_,1);
    local_560[0] = uVar5;
LAB_001241a4:
    pvVar6 = result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::unwrap((result<toml::value_t,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_568);
    switch(*pvVar6) {
    case boolean:
      parse_boolean_abi_cxx11_(&local_308,this,loc_00);
      this_00 = &local_308;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,bool>
                (__return_storage_ptr__,(detail *)this_00,rslt);
      result<std::pair<bool,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_308,(EVP_PKEY_CTX *)this_00);
      break;
    case integer:
      parse_integer_abi_cxx11_(&local_360,this,loc_00);
      this_06 = &local_360;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,long>
                (__return_storage_ptr__,(detail *)this_06,rslt_05);
      result<std::pair<long,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_360,(EVP_PKEY_CTX *)this_06);
      break;
    case floating:
      parse_floating_abi_cxx11_(&local_3b8,this,loc_00);
      this_03 = &local_3b8;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,double>
                (__return_storage_ptr__,(detail *)this_03,rslt_02);
      result<std::pair<double,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_3b8,(EVP_PKEY_CTX *)this_03);
      break;
    case string:
      parse_string_abi_cxx11_(&local_128,this,loc_00);
      this_04 = &local_128;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::string>
                (__return_storage_ptr__,(detail *)this_04,rslt_03);
      result<std::pair<toml::string,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_128,(EVP_PKEY_CTX *)this_04);
      break;
    case offset_datetime:
      parse_offset_datetime_abi_cxx11_(&local_1f0,this,loc_00);
      this_01 = &local_1f0;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::offset_datetime>
                (__return_storage_ptr__,(detail *)this_01,rslt_00);
      result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_1f0,(EVP_PKEY_CTX *)this_01);
      break;
    case local_datetime:
      parse_local_datetime_abi_cxx11_(&local_250,this,loc_00);
      this_07 = &local_250;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_datetime>
                (__return_storage_ptr__,(detail *)this_07,rslt_06);
      result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_250,(EVP_PKEY_CTX *)this_07);
      break;
    case local_date:
      parse_local_date_abi_cxx11_(&local_410,this,loc_00);
      this_08 = &local_410;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_date>
                (__return_storage_ptr__,(detail *)this_08,rslt_07);
      result<std::pair<toml::local_date,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_410,(EVP_PKEY_CTX *)this_08);
      break;
    case local_time:
      parse_local_time_abi_cxx11_(&local_2b0,this,loc_00);
      this_05 = &local_2b0;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,toml::local_time>
                (__return_storage_ptr__,(detail *)this_05,rslt_04);
      result<std::pair<toml::local_time,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_2b0,(EVP_PKEY_CTX *)this_05);
      break;
    case array:
      parse_array<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                (&local_190,this,loc,0x16f274);
      this_09 = &local_190;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::vector<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::allocator<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>
                (__return_storage_ptr__,(detail *)this_09,rslt_08);
      result<std::pair<std::vector<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::allocator<toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_190,(EVP_PKEY_CTX *)this_09);
      break;
    case table:
      parse_inline_table<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>
                (&local_b0,this,loc,0x16f274);
      this_02 = &local_b0;
      parse_value_helper<toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::unordered_map<std::__cxx11::string,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,toml::basic_value<toml::discard_comments,std::unordered_map,std::vector>>>>>
                (__return_storage_ptr__,(detail *)this_02,rslt_01);
      result<std::pair<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_toml::basic_value<toml::discard_comments,_std::unordered_map,_std::vector>_>_>_>,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::cleanup(&local_b0,(EVP_PKEY_CTX *)this_02);
      break;
    default:
      local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_540,"toml::parse_value: unknown token appeared","");
      source_location::source_location(&local_460,(location *)this);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[8],_true>
                (&local_4d0,&local_460,(char (*) [8])"unknown");
      __l_00._M_len = 1;
      __l_00._M_array = &local_4d0;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector(&local_500,__l_00,&local_569);
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_4e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      format_underline(&local_520,&local_540,&local_500,&local_4e8,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4e8);
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_500);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4d0.second._M_dataplus._M_p != &local_4d0.second.field_2) {
        operator_delete(local_4d0.second._M_dataplus._M_p,
                        local_4d0.second.field_2._M_allocated_capacity + 1);
      }
      source_location::~source_location(&local_4d0.first);
      source_location::~source_location(&local_460);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_540._M_dataplus._M_p != &local_540.field_2) {
        operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
      }
      location::reset((location *)this,rollback);
      local_4d0.first._0_8_ = (pointer)((long)&local_4d0 + 0x10U);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4d0,local_520._M_dataplus._M_p,
                 local_520._M_dataplus._M_p + local_520._M_string_length);
      __return_storage_ptr__->is_ok_ = false;
      paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_1 = paVar1;
      if ((pointer)local_4d0.first._0_8_ == (pointer)((long)&local_4d0 + 0x10U)) {
        paVar1->_M_allocated_capacity = (size_type)local_4d0.first.file_name_._M_dataplus._M_p;
        *(size_type *)((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8) =
             local_4d0.first.file_name_._M_string_length;
      }
      else {
        (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p =
             (pointer)local_4d0.first._0_8_;
        (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
             (size_type)local_4d0.first.file_name_._M_dataplus._M_p;
      }
      (__return_storage_ptr__->field_1).fail.value._M_string_length = local_4d0.first._8_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_520._M_dataplus._M_p != &local_520.field_2) {
        operator_delete(local_520._M_dataplus._M_p,
                        CONCAT71(local_520.field_2._M_allocated_capacity._1_7_,
                                 local_520.field_2._M_local_buf[0]) + 1);
      }
    }
  }
  if (local_568._0_1_ != false) {
    return __return_storage_ptr__;
  }
  local_540.field_2._M_allocated_capacity = auStack_550._0_8_;
  _Var8._M_p = (pointer)local_560._0_8_;
  if ((undefined1 *)local_560._0_8_ == auStack_550) {
    return __return_storage_ptr__;
  }
LAB_001245f0:
  operator_delete(_Var8._M_p,local_540.field_2._M_allocated_capacity + 1);
  return __return_storage_ptr__;
}

Assistant:

result<Value, std::string> parse_value(location& loc, const std::size_t n_rec)
{
    const auto first = loc.iter();
    if(first == loc.end())
    {
        return err(format_underline("toml::parse_value: input is empty",
                   {{source_location(loc), ""}}));
    }

    const auto type = guess_value_type(loc);
    if(!type)
    {
        return err(type.unwrap_err());
    }

    switch(type.unwrap())
    {
        case value_t::boolean        : {return parse_value_helper<Value>(parse_boolean(loc)            );}
        case value_t::integer        : {return parse_value_helper<Value>(parse_integer(loc)            );}
        case value_t::floating       : {return parse_value_helper<Value>(parse_floating(loc)           );}
        case value_t::string         : {return parse_value_helper<Value>(parse_string(loc)             );}
        case value_t::offset_datetime: {return parse_value_helper<Value>(parse_offset_datetime(loc)    );}
        case value_t::local_datetime : {return parse_value_helper<Value>(parse_local_datetime(loc)     );}
        case value_t::local_date     : {return parse_value_helper<Value>(parse_local_date(loc)         );}
        case value_t::local_time     : {return parse_value_helper<Value>(parse_local_time(loc)         );}
        case value_t::array          : {return parse_value_helper<Value>(parse_array<Value>(loc, n_rec));}
        case value_t::table          : {return parse_value_helper<Value>(parse_inline_table<Value>(loc, n_rec));}
        default:
        {
            const auto msg = format_underline("toml::parse_value: "
                    "unknown token appeared", {{source_location(loc), "unknown"}});
            loc.reset(first);
            return err(msg);
        }
    }
}